

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone_example_universe.h
# Opt level: O2

void CloneUniverse(Example *in,Example *out)

{
  size_t i;
  ulong uVar1;
  CD_Scene local_80 [104];
  
  Example::initializeUniverse(out);
  sch::CD_Scene::CD_Scene(local_80);
  sch::CD_Scene::operator=(&out->sObj,local_80);
  sch::CD_Scene::~CD_Scene(local_80);
  uVar1 = 0;
  while( true ) {
    if ((ulong)(*(long *)&in->field_0x10 - *(long *)&in->field_0x8 >> 3) <= uVar1) break;
    (**(code **)(**(long **)(*(long *)&in->field_0x8 + uVar1 * 8) + 8))();
    sch::CD_Scene::addObject((S_Object *)out);
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

inline void CloneUniverse(Example & in, Example & out)
{
  // Initialize the universe to have the correct names
  out.initializeUniverse();
  // Clear the scene
  out.sObj = sch::CD_Scene();
  for(size_t i = 0; i < in.sObj.size(); ++i)
  {
    out.sObj.addObject(in.sObj[i]->clone());
  }
}